

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O2

MPP_RET vdpu383_av1d_start(void *hal,HalTaskInfo *task)

{
  long *plVar1;
  long lVar2;
  MppDev ctx;
  MPP_RET MVar3;
  long *plVar4;
  char *fname;
  char *fmt;
  int level;
  ulong uVar5;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  
  if (hal == (void *)0x0) {
    if (((byte)hal_av1d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    level = 4;
    fname = (char *)0x0;
    uVar5 = 0x9b4;
    goto LAB_0020a3ed;
  }
  if (((ulong)(task->dec).flags & 0xc) != 0) {
    return MPP_OK;
  }
  plVar1 = *(long **)((long)hal + 0x50);
  plVar4 = plVar1;
  if (*(int *)((long)hal + 0x58) != 0) {
    plVar4 = plVar1 + (long)(task->dec).reg_index * 2 + 3;
  }
  lVar2 = *plVar4;
  ctx = *(MppDev *)((long)hal + 0x48);
  wr_cfg.reg = (void *)(lVar2 + 4);
  wr_cfg.size = 0x5c;
  wr_cfg.offset = 0x20;
  MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
  if (MVar3 == MPP_OK) {
    wr_cfg.reg = (void *)(lVar2 + 0x60);
    wr_cfg.size = 0x88;
    wr_cfg.offset = 0x200;
    MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar3 != MPP_OK) goto LAB_0020a3ab;
    wr_cfg.reg = (void *)(lVar2 + 0xe8);
    wr_cfg.size = 0xac;
    wr_cfg.offset = 0x100;
    MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar3 != MPP_OK) goto LAB_0020a3ab;
    wr_cfg.reg = (void *)(lVar2 + 0x194);
    wr_cfg.size = 0x104;
    wr_cfg.offset = 0x2a0;
    MVar3 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar3 != MPP_OK) goto LAB_0020a3ab;
    rd_cfg.reg = (void *)(lVar2 + 0x20);
    rd_cfg.size = 4;
    rd_cfg.offset = 0x3c;
    MVar3 = mpp_dev_ioctl(ctx,5,&rd_cfg);
    if (MVar3 == MPP_OK) {
      vdpu383_set_rcbinfo(ctx,(Vdpu383RcbInfo *)((long)plVar1 + 100));
      MVar3 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
      if (MVar3 == MPP_OK) {
        return MPP_OK;
      }
      fmt = "send cmd failed %d\n";
    }
    else {
      fmt = "set register read failed %d\n";
    }
  }
  else {
LAB_0020a3ab:
    fmt = "set register write failed %d\n";
  }
  fname = "vdpu383_av1d_start";
  level = 2;
  uVar5 = (ulong)(uint)MVar3;
LAB_0020a3ed:
  _mpp_log_l(level,"hal_av1d_vdpu383",fmt,fname,uVar5);
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    INP_CHECK(ret, NULL == p_hal);
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        goto __RETURN;
    }

    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs = p_hal->fast_mode ?
                              reg_ctx->reg_buf[task->dec.reg_index].regs :
                              reg_ctx->regs;
    MppDev dev = p_hal->dev;
    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->ctrl_regs;
        wr_cfg.size = sizeof(regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->common_addr;
        wr_cfg.size = sizeof(regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->av1d_paras;
        wr_cfg.size = sizeof(regs->av1d_paras);
        wr_cfg.offset = OFFSET_AV1D_PARAS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->av1d_addrs;
        wr_cfg.size = sizeof(regs->av1d_addrs);
        wr_cfg.offset = OFFSET_AV1D_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu383_set_rcbinfo(dev, (Vdpu383RcbInfo*)reg_ctx->rcb_buf_info);

        /* send request to hardware */
        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

__RETURN:
    return ret = MPP_OK;
}